

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenStringWTF16GetSetPos(BinaryenExpressionRef expr,BinaryenExpressionRef posExpr)

{
  if (expr->_id != StringWTF16GetId) {
    __assert_fail("expression->is<StringWTF16Get>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x12b7,
                  "void BinaryenStringWTF16GetSetPos(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (posExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)posExpr;
    return;
  }
  __assert_fail("posExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x12b8,
                "void BinaryenStringWTF16GetSetPos(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringWTF16GetSetPos(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef posExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringWTF16Get>());
  assert(posExpr);
  static_cast<StringWTF16Get*>(expression)->pos = (Expression*)posExpr;
}